

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_publish2process(fio_msg_internal_s *m)

{
  channel_s *pcVar1;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  fio_str_info_s name;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [24];
  int iVar5;
  fio_msg_internal_s *pfVar6;
  char *in_stack_ffffffffffffff70;
  fio_ch_set__ordered_s_ *local_38;
  fio_ch_set__ordered_s_ *p;
  channel_s *local_18;
  channel_s *ch;
  fio_msg_internal_s *m_local;
  
  fio_msg_internal_finalize(m);
  if (m->filter == 0) {
    uVar2 = (m->channel).len;
    uVar3 = (m->channel).data;
    name.len = uVar3;
    name.capa = uVar2;
    name.data = in_stack_ffffffffffffff70;
    local_18 = fio_channel_find_dup(name);
  }
  else {
    local_18 = fio_filter_find_dup(m->filter);
    if (local_18 == (channel_s *)0x0) goto LAB_00146b44;
  }
  if (local_18 != (channel_s *)0x0) {
    pfVar6 = fio_msg_internal_dup(m);
    task.arg1 = local_18;
    task.func = fio_publish2channel_task;
    task.arg2 = pfVar6;
    fio_defer_push_task_fn(task,&task_queue_urgent);
  }
  if (m->filter == 0) {
    fio_lock(&fio_postoffice.patterns.lock);
    for (local_38 = fio_postoffice.patterns.channels.ordered;
        local_38 != (fio_ch_set__ordered_s_ *)0x0 &&
        local_38 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
        local_38 = local_38 + 1) {
      if ((local_38->hash != 0) &&
         (auVar4._8_8_ = local_38->obj->name, auVar4._0_8_ = local_38->obj->name_len,
         auVar4._16_8_ = 0,
         iVar5 = (*local_38->obj->match)((fio_str_info_s)(auVar4 << 0x40),m->channel), iVar5 != 0))
      {
        fio_channel_dup(local_38->obj);
        pcVar1 = local_38->obj;
        pfVar6 = fio_msg_internal_dup(m);
        task_00.arg1 = pcVar1;
        task_00.func = fio_publish2channel_task;
        task_00.arg2 = pfVar6;
        fio_defer_push_task_fn(task_00,&task_queue_urgent);
      }
    }
    fio_unlock(&fio_postoffice.patterns.lock);
  }
LAB_00146b44:
  fio_msg_internal_free(m);
  return;
}

Assistant:

static void fio_publish2process(fio_msg_internal_s *m) {
  fio_msg_internal_finalize(m);
  channel_s *ch;
  if (m->filter) {
    ch = fio_filter_find_dup(m->filter);
    if (!ch) {
      goto finish;
    }
  } else {
    ch = fio_channel_find_dup(m->channel);
  }
  /* exact match */
  if (ch) {
    fio_defer_push_urgent(fio_publish2channel_task, ch,
                          fio_msg_internal_dup(m));
  }
  if (m->filter == 0) {
    /* pattern matching match */
    fio_lock(&fio_postoffice.patterns.lock);
    FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, p) {
      if (!p->hash) {
        continue;
      }

      if (p->obj->match(
              (fio_str_info_s){.data = p->obj->name, .len = p->obj->name_len},
              m->channel)) {
        fio_channel_dup(p->obj);
        fio_defer_push_urgent(fio_publish2channel_task, p->obj,
                              fio_msg_internal_dup(m));
      }
    }
    fio_unlock(&fio_postoffice.patterns.lock);
  }
finish:
  fio_msg_internal_free(m);
}